

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_ungrouped_aggregate.cpp
# Opt level: O3

SourceResultType __thiscall
duckdb::PhysicalUngroupedAggregate::GetData
          (PhysicalUngroupedAggregate *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  pointer pGVar1;
  
  pGVar1 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator->(&(this->super_PhysicalOperator).sink_state);
  GlobalUngroupedAggregateState::Finalize((GlobalUngroupedAggregateState *)(pGVar1 + 1),chunk,0);
  return FINISHED;
}

Assistant:

SourceResultType PhysicalUngroupedAggregate::GetData(ExecutionContext &context, DataChunk &chunk,
                                                     OperatorSourceInput &input) const {
	auto &gstate = sink_state->Cast<UngroupedAggregateGlobalSinkState>();
	D_ASSERT(gstate.finished);

	// initialize the result chunk with the aggregate values
	gstate.state.Finalize(chunk);
	VerifyNullHandling(chunk, gstate.state.state, aggregates);

	return SourceResultType::FINISHED;
}